

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::NewKey
          (TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_> *this,
          short key)

{
  Node *pNVar1;
  IPair IVar2;
  undefined2 uVar3;
  Node *pNVar4;
  Node *pNVar5;
  uint uVar6;
  hash_t hVar7;
  undefined6 in_register_00000032;
  Node *pNVar8;
  Node *pNVar9;
  uint uVar10;
  
  pNVar5 = this->Nodes;
  hVar7 = this->Size;
  do {
    uVar10 = hVar7 - 1 & (uint)CONCAT62(in_register_00000032,key);
    pNVar1 = pNVar5 + uVar10;
    pNVar4 = pNVar5[uVar10].Next;
    if (pNVar4 == (Node *)0x1) {
LAB_00566c5a:
      pNVar9 = (Node *)0x0;
      pNVar5 = pNVar1;
LAB_00566c5f:
      pNVar1->Next = pNVar9;
      this->NumUsed = this->NumUsed + 1;
      (pNVar5->Pair).Key = key;
      return pNVar5;
    }
    pNVar9 = this->LastFree;
    while (pNVar8 = pNVar9, pNVar9 = pNVar8 + -1, pNVar5 < pNVar8) {
      if (pNVar9->Next == (Node *)0x1) {
        this->LastFree = pNVar9;
        uVar6 = hVar7 - 1 & (int)(pNVar1->Pair).Key;
        if (uVar6 != uVar10) {
          pNVar5 = pNVar5 + uVar6;
          do {
            pNVar4 = pNVar5;
            pNVar5 = pNVar4->Next;
          } while (pNVar5 != pNVar1);
          pNVar4->Next = pNVar9;
          IVar2 = pNVar1->Pair;
          uVar3 = *(undefined2 *)&pNVar1->field_0xe;
          pNVar9->Next = pNVar1->Next;
          pNVar8[-1].Pair = IVar2;
          *(undefined2 *)&pNVar8[-1].field_0xe = uVar3;
          goto LAB_00566c5a;
        }
        pNVar9->Next = pNVar4;
        pNVar5 = pNVar9;
        goto LAB_00566c5f;
      }
    }
    this->LastFree = pNVar9;
    Resize(this,hVar7 * 2);
    pNVar5 = this->Nodes;
    hVar7 = this->Size;
  } while( true );
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}